

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

XMLCh * __thiscall
xercesc_4_0::TraverseSchema::traverseNotationDecl
          (TraverseSchema *this,DOMElement *elem,XMLCh *name,XMLCh *uriStr)

{
  ulong uVar1;
  SchemaInfo *pSVar2;
  ValueVectorOf<int> *pVVar3;
  ulong uVar4;
  SchemaInfo *pSVar5;
  RefVectorOf<xercesc_4_0::SchemaInfo> *pRVar6;
  XMLSize_t XVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  DOMElement *elem_00;
  XMLCh *pXVar11;
  Grammar *pGVar12;
  SchemaInfo *this_00;
  ulong uVar13;
  XMLSize_t getAt;
  NamespaceScopeManager nsMgr;
  NamespaceScopeManager local_40;
  
  pSVar2 = this->fSchemaInfo;
  if (elem == (DOMElement *)0x0) {
    local_40.fScopeAdded = false;
  }
  else {
    local_40.fScopeAdded = retrieveNamespaceMapping(this,elem);
  }
  local_40.fSchemaInfo = pSVar2;
  iVar9 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                    (this->fURIStringPool,uriStr);
  pSVar2 = this->fSchemaInfo;
  this_00 = pSVar2;
  if (this->fTargetNSURI == iVar9) {
LAB_0032f86c:
    elem_00 = SchemaInfo::getTopLevelComponent(this_00,6,L"notation",name,&this->fSchemaInfo);
    if (elem_00 != (DOMElement *)0x0) {
      pXVar11 = traverseNotationDecl(this,elem_00);
      this->fSchemaInfo = pSVar2;
      this->fTargetNSURI = pSVar2->fTargetNSURI;
      goto LAB_0032f9df;
    }
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x81,uriStr,name,
                      (XMLCh *)0x0,(XMLCh *)0x0);
  }
  else {
    iVar9 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])();
    pVVar3 = this->fImportedNSList;
    if ((pVVar3 == (ValueVectorOf<int> *)0x0) || (uVar4 = pVVar3->fCurCount, uVar4 == 0)) {
LAB_0032f9b8:
      pXVar11 = (XMLCh *)0x0;
      reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x8e,uriStr,
                        (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      goto LAB_0032f9df;
    }
    if (*pVVar3->fElemList != iVar9) {
      uVar13 = 0;
      do {
        if (uVar4 - 1 == uVar13) goto LAB_0032f9b8;
        uVar1 = uVar13 + 1;
        lVar8 = uVar13 + 1;
        uVar13 = uVar1;
      } while (pVVar3->fElemList[lVar8] != iVar9);
      if (uVar4 <= uVar1) goto LAB_0032f9b8;
    }
    pGVar12 = GrammarResolver::getGrammar(this->fGrammarResolver,uriStr);
    if ((pGVar12 == (Grammar *)0x0) ||
       (iVar10 = (*(pGVar12->super_XSerializable)._vptr_XSerializable[5])(pGVar12), iVar10 != 1)) {
      pXVar11 = (XMLCh *)0x0;
      reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLValidity",0x26,uriStr,
                        (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      goto LAB_0032f9df;
    }
    pSVar5 = this->fSchemaInfo;
    pRVar6 = pSVar5->fImportedInfoList;
    if ((pRVar6 != (RefVectorOf<xercesc_4_0::SchemaInfo> *)0x0) &&
       (XVar7 = (pRVar6->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fCurCount, XVar7 != 0)) {
      getAt = 0;
      do {
        this_00 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt
                            (&pSVar5->fImportedInfoList->
                              super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,getAt);
        if (this_00->fTargetNSURI == iVar9) {
          if (this_00->fProcessed != true) {
            this->fSchemaInfo = this_00;
            this->fTargetNSURI = iVar9;
            goto LAB_0032f86c;
          }
          break;
        }
        getAt = getAt + 1;
      } while (XVar7 != getAt);
    }
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x28,uriStr,name,
                      (XMLCh *)0x0,(XMLCh *)0x0);
  }
  pXVar11 = (XMLCh *)0x0;
LAB_0032f9df:
  NamespaceScopeManager::~NamespaceScopeManager(&local_40);
  return pXVar11;
}

Assistant:

const XMLCh* TraverseSchema::traverseNotationDecl(const DOMElement* const elem,
                                                  const XMLCh* const name,
                                                  const XMLCh* const uriStr) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    unsigned int uriId = fURIStringPool->addOrFind(uriStr);
    SchemaInfo*  saveInfo = fSchemaInfo;

    if (fTargetNSURI != (int) uriId) {

        // Make sure that we have an explicit import statement.
        // Clause 4 of Schema Representation Constraint:
        // http://www.w3.org/TR/xmlschema-1/#src-resolve
        unsigned int uriId = fURIStringPool->addOrFind(uriStr);

        if (!isImportingNS(uriId)) {

            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidNSReference, uriStr);
            return 0;
        }

        Grammar* grammar = fGrammarResolver->getGrammar(uriStr);

        if (grammar == 0 || grammar->getGrammarType() != Grammar::SchemaGrammarType) {

            reportSchemaError(elem, XMLUni::fgValidityDomain, XMLValid::GrammarNotFound, uriStr);
            return 0;
        }

        SchemaInfo* impInfo = fSchemaInfo->getImportInfo(uriId);

        if (!impInfo || impInfo->getProcessed()) {

            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TypeNotFound, uriStr, name);
            return 0;
        }

        fSchemaInfo = impInfo;
        fTargetNSURI = fSchemaInfo->getTargetNSURI();
    }

    DOMElement* notationElem = fSchemaInfo->getTopLevelComponent(SchemaInfo::C_Notation,
        SchemaSymbols::fgELT_NOTATION, name, &fSchemaInfo);

    if (notationElem == 0) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::Notation_DeclNotFound, uriStr, name);
        return 0;
    }

    const XMLCh* notationName = traverseNotationDecl(notationElem);

    fSchemaInfo = saveInfo;
    fTargetNSURI = fSchemaInfo->getTargetNSURI();

    return notationName;
}